

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_Rectangle2D(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var_00;
  char *__s;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  _List_node_base *p_Var9;
  string *psVar10;
  int pAttrIdx;
  ulong uVar11;
  CX3DImporter_NodeElement *ne;
  aiVector2D size;
  string an;
  string use;
  string def;
  CX3DImporter_NodeElement *local_c0;
  undefined8 local_b8;
  allocator<char> local_a9;
  X3DImporter *local_a8;
  float local_a0;
  float local_9c;
  aiVector2D local_98;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_01;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_98.x = 2.0;
  local_98.y = 2.0;
  local_c0 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  uVar11 = 0;
  if (0 < (int)uVar7) {
    local_b8 = 0;
    local_a8 = this;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar11;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,(char *)CONCAT44(extraout_var_00,iVar8),&local_a9);
      iVar8 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_01,iVar8);
        psVar10 = &local_50;
LAB_006ac5a9:
        pcVar3 = (char *)psVar10->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar3,(ulong)__s);
        this = local_a8;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_02,iVar8);
          psVar10 = &local_70;
          goto LAB_006ac5a9;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar8 != 0) {
          iVar8 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar8 != 0) {
            iVar8 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar8 != 0) {
              iVar8 = std::__cxx11::string::compare((char *)&local_90);
              if (iVar8 == 0) {
                XML_ReadNode_GetAttrVal_AsVec2f(this,pAttrIdx,&local_98);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)&local_90);
                if (iVar8 == 0) {
                  bVar6 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                  local_b8 = CONCAT71(extraout_var,bVar6);
                }
                else {
                  Throw_IncorrectAttr(this,&local_90);
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      uVar11 = (ulong)(pAttrIdx + 1U);
    } while (uVar7 != pAttrIdx + 1U);
    uVar11 = (ulong)((byte)local_b8 & 1);
  }
  if (local_70._M_string_length == 0) {
    local_c0 = (CX3DImporter_NodeElement *)operator_new(0x78);
    pCVar4 = this->NodeElement_Cur;
    local_c0->Type = ENET_Rectangle2D;
    (local_c0->ID)._M_dataplus._M_p = (pointer)&(local_c0->ID).field_2;
    (local_c0->ID)._M_string_length = 0;
    (local_c0->ID).field_2._M_local_buf[0] = '\0';
    local_c0->Parent = pCVar4;
    (local_c0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c0->Child;
    (local_c0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0->Child;
    (local_c0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_c0->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry2D_008ff818;
    *(CX3DImporter_NodeElement **)&local_c0[1].Type = local_c0 + 1;
    local_c0[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_c0 + 1);
    local_c0[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_c0[1].ID.field_2._M_local_buf[0] = '\x01';
    if (local_50._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_c0->ID);
    }
    pCVar4 = local_c0;
    local_b8._0_4_ = local_98.x;
    local_a8._0_4_ = local_98.y;
    p_Var9 = (_List_node_base *)operator_new(0x20);
    local_9c = (float)local_b8 * 0.5;
    local_a0 = local_a8._0_4_ * -0.5;
    *(float *)&p_Var9[1]._M_next = local_9c;
    *(float *)((long)&p_Var9[1]._M_next + 4) = local_a0;
    *(undefined4 *)&p_Var9[1]._M_prev = 0;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
    p_Var9 = (_List_node_base *)operator_new(0x20);
    local_a8._0_4_ = local_a8._0_4_ * 0.5;
    *(float *)&p_Var9[1]._M_next = local_9c;
    *(float *)((long)&p_Var9[1]._M_next + 4) = local_a8._0_4_;
    *(undefined4 *)&p_Var9[1]._M_prev = 0;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
    p_Var9 = (_List_node_base *)operator_new(0x20);
    local_b8._0_4_ = (float)local_b8 * -0.5;
    *(float *)&p_Var9[1]._M_next = (float)local_b8;
    *(float *)((long)&p_Var9[1]._M_next + 4) = local_a8._0_4_;
    *(undefined4 *)&p_Var9[1]._M_prev = 0;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
    p_Var9 = (_List_node_base *)operator_new(0x20);
    *(float *)&p_Var9[1]._M_next = (float)local_b8;
    *(float *)((long)&p_Var9[1]._M_next + 4) = local_a0;
    *(undefined4 *)&p_Var9[1]._M_prev = 0;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
    local_c0[1].ID.field_2._M_local_buf[0] = (char)uVar11;
    local_c0[1].ID._M_string_length = 4;
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_c0;
    if ((char)iVar8 == '\0') {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Rectangle2D","");
      ParseNode_Metadata(this,pCVar4,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)local_c0;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_c0;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_50._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_70,ENET_Rectangle2D,&local_c0);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_70);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_c0;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar4->Child;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_Rectangle2D()
{
    std::string def, use;
    aiVector2D size(2, 2);
    bool solid = false;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("size", size, XML_ReadNode_GetAttrVal_AsVec2f);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Rectangle2D, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_Rectangle2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		float x1 = -size.x / 2.0f;
		float x2 = size.x / 2.0f;
		float y1 = -size.y / 2.0f;
		float y2 = size.y / 2.0f;
		std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices;// just short alias.

		vlist.push_back(aiVector3D(x2, y1, 0));// 1st point
		vlist.push_back(aiVector3D(x2, y2, 0));// 2nd point
		vlist.push_back(aiVector3D(x1, y2, 0));// 3rd point
		vlist.push_back(aiVector3D(x1, y1, 0));// 4th point
		((CX3DImporter_NodeElement_Geometry2D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 4;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Rectangle2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}